

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

mylanguage_parser * __thiscall
yy::mylanguage_parser::yytnamerr__abi_cxx11_(mylanguage_parser *this,char *yystr)

{
  char cVar1;
  char *pcVar2;
  allocator local_39;
  int local_38;
  char *local_28;
  char *yyp;
  char *local_18;
  char *yystr_local;
  string *yyr;
  
  local_18 = yystr;
  yystr_local = (char *)this;
  if (*yystr == '\"') {
    yyp._7_1_ = 0;
    std::__cxx11::string::string((string *)this);
    local_28 = local_18;
    while( true ) {
      pcVar2 = local_28 + 1;
      cVar1 = local_28[1];
      if (cVar1 == '\"') break;
      if (((cVar1 == '\'') || (cVar1 == ',')) ||
         ((cVar1 == '\\' && (pcVar2 = local_28 + 2, local_28[2] != '\\')))) {
        local_28 = pcVar2;
        local_38 = 0;
        goto LAB_00112691;
      }
      local_28 = pcVar2;
      std::__cxx11::string::operator+=((string *)this,*local_28);
    }
    yyp._7_1_ = 1;
    local_38 = 1;
    local_28 = pcVar2;
LAB_00112691:
    if ((yyp._7_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)this);
    }
    if (local_38 != 0) {
      return this;
    }
  }
  pcVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return this;
}

Assistant:

std::string
  mylanguage_parser::yytnamerr_ (const char *yystr)
  {
    if (*yystr == '"')
      {
        std::string yyr;
        char const *yyp = yystr;

        for (;;)
          switch (*++yyp)
            {
            case '\'':
            case ',':
              goto do_not_strip_quotes;

            case '\\':
              if (*++yyp != '\\')
                goto do_not_strip_quotes;
              else
                goto append;

            append:
            default:
              yyr += *yyp;
              break;

            case '"':
              return yyr;
            }
      do_not_strip_quotes: ;
      }

    return yystr;
  }